

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void av1_setup_frame_sign_bias(AV1_COMMON *cm)

{
  int iVar1;
  RefCntBuffer *pRVar2;
  long in_RDI;
  int ref_order_hint;
  RefCntBuffer *buf;
  MV_REFERENCE_FRAME ref_frame;
  MV_REFERENCE_FRAME in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  char local_9;
  
  for (local_9 = '\x01'; local_9 < '\b'; local_9 = local_9 + '\x01') {
    pRVar2 = get_ref_frame_buf((AV1_COMMON *)
                               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffdf);
    if ((*(int *)(*(long *)(in_RDI + 0x6088) + 0x28) == 0) || (pRVar2 == (RefCntBuffer *)0x0)) {
      *(undefined4 *)(in_RDI + 0x6364 + (long)local_9 * 4) = 0;
    }
    else {
      in_stack_ffffffffffffffe4 = pRVar2->order_hint;
      iVar1 = get_relative_dist((OrderHintInfo *)(*(long *)(in_RDI + 0x6088) + 0x28),
                                in_stack_ffffffffffffffe4,*(int *)(in_RDI + 4));
      *(uint *)(in_RDI + 0x6364 + (long)local_9 * 4) = (uint)(0 < iVar1);
    }
  }
  return;
}

Assistant:

void av1_setup_frame_sign_bias(AV1_COMMON *cm) {
  MV_REFERENCE_FRAME ref_frame;
  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    if (cm->seq_params->order_hint_info.enable_order_hint && buf != NULL) {
      const int ref_order_hint = buf->order_hint;
      cm->ref_frame_sign_bias[ref_frame] =
          (get_relative_dist(&cm->seq_params->order_hint_info, ref_order_hint,
                             (int)cm->current_frame.order_hint) <= 0)
              ? 0
              : 1;
    } else {
      cm->ref_frame_sign_bias[ref_frame] = 0;
    }
  }
}